

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O2

void duckdb::RemapStruct(Vector *input,Vector *default_vector,Vector *result,idx_t result_size,
                        vector<duckdb::RemapColumnInfo,_true> *remap_info)

{
  unsigned_long *puVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  const_reference this;
  idx_t iVar2;
  reference pvVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar4;
  Vector *pVVar5;
  type pVVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  pointer pVVar7;
  InternalException *pIVar8;
  ulong uVar9;
  idx_t i;
  allocator local_b5;
  undefined4 local_b4;
  Vector *local_b0;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_a8;
  idx_t local_a0;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_98;
  vector<duckdb::RemapColumnInfo,_true> *local_90;
  ValidityMask *local_88;
  type local_80;
  UnifiedVectorFormat format;
  
  local_a0 = result_size;
  local_98 = StructVector::GetEntries(input);
  local_b0 = result;
  local_a8 = StructVector::GetEntries(result);
  pVVar5 = local_b0;
  local_90 = remap_info;
  if ((long)(local_a8->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_a8->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 !=
      ((long)(remap_info->
             super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish -
      (long)(remap_info->
            super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
            super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
            _M_impl.super__Vector_impl_data._M_start) / 0x28) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&format,"Remap info unaligned in remap struct",&local_b5);
    InternalException::InternalException(pIVar8,(string *)&format);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      local_b4 = 0;
    }
    else {
      if ((*puVar1 & 1) == 0) {
        ConstantVector::SetNull(local_b0,true);
        Vector::SetVectorType(pVVar5,CONSTANT_VECTOR);
        return;
      }
      local_b4 = 0;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,local_a0,&format);
    pVVar5 = local_b0;
    if (format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_b4 = 0;
    }
    else {
      FlatVector::VerifyFlatVector(local_b0);
      uVar9 = extraout_RAX;
      for (iVar2 = 0; local_a0 != iVar2; iVar2 = iVar2 + 1) {
        uVar9 = iVar2;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(format.sel)->sel_vector[iVar2];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
             (unsigned_long *)0x0) &&
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6] >>
             (uVar9 & 0x3f) & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar5->validity).super_TemplatedValidityMask<unsigned_long>,iVar2);
          uVar9 = extraout_RAX_00;
        }
      }
      local_b4 = (undefined4)
                 CONCAT71((int7)(uVar9 >> 8),
                          (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_mask != (unsigned_long *)0x0);
    }
    pVVar5 = local_b0;
    UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  }
  local_88 = &pVVar5->validity;
  uVar9 = 0;
  do {
    if ((ulong)(((long)(local_90->
                       super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                       ).
                       super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_90->
                      super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                      ).
                      super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar9) {
      return;
    }
    this = vector<duckdb::RemapColumnInfo,_true>::get<true>(local_90,uVar9);
    if (((this->index).index == 0xffffffffffffffff) ||
       ((this->child_remap_info).
        super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->child_remap_info).
        super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((this->default_index).index == 0xffffffffffffffff) {
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(local_a8,uVar9);
        pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                           (pvVar3);
        iVar2 = optional_idx::GetIndex(&this->index);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(local_98,iVar2);
        pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pvVar3);
        Vector::Reference(pVVar7,pVVar6);
      }
      else {
        this_00 = StructVector::GetEntries(default_vector);
        pvVar4 = local_a8;
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(local_a8,uVar9);
        pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                           (pvVar3);
        iVar2 = optional_idx::GetIndex(&this->default_index);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(this_00,iVar2);
        pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pvVar3);
        Vector::Reference(pVVar7,pVVar6);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(pvVar4,uVar9);
        pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                           (pvVar3);
        if (pVVar7->vector_type != CONSTANT_VECTOR) {
          pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&format,"Default value in remap struct must be a constant",&local_b5)
          ;
          InternalException::InternalException(pIVar8,(string *)&format);
          __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((char)local_b4 != '\0') {
          pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                   ::get<true>(local_a8,uVar9);
          pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             (pvVar3);
          pvVar4 = local_a8;
          puVar1 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
            pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::get<true>(local_a8,uVar9);
            pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar3);
            Vector::Flatten(pVVar7,local_a0);
            pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::get<true>(pvVar4,uVar9);
            pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(pvVar3);
            FlatVector::VerifyFlatVector(local_b0);
            FlatVector::SetValidity(pVVar6,local_88);
          }
        }
      }
    }
    else {
      iVar2 = optional_idx::GetIndex(&this->index);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(local_98,iVar2);
      local_80 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pvVar3);
      pVVar5 = default_vector;
      if ((this->default_index).index != 0xffffffffffffffff) {
        pvVar4 = StructVector::GetEntries(default_vector);
        iVar2 = optional_idx::GetIndex(&this->default_index);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(pvVar4,iVar2);
        pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pvVar3);
      }
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(local_a8,uVar9);
      pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar3);
      RemapStruct(local_80,pVVar5,pVVar6,local_a0,&this->child_remap_info);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void RemapStruct(Vector &input, Vector &default_vector, Vector &result, idx_t result_size,
                        const vector<RemapColumnInfo> &remap_info) {
	auto &input_vectors = StructVector::GetEntries(input);
	auto &result_vectors = StructVector::GetEntries(result);
	if (result_vectors.size() != remap_info.size()) {
		throw InternalException("Remap info unaligned in remap struct");
	}
	bool has_top_level_null = false;
	// copy over the NULL values from the input vector
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(input)) {
			ConstantVector::SetNull(result, true);
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			return;
		}
	} else {
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(result_size, format);
		if (!format.validity.AllValid()) {
			auto &result_validity = FlatVector::Validity(result);
			for (idx_t i = 0; i < result_size; i++) {
				auto input_idx = format.sel->get_index(i);
				if (!format.validity.RowIsValid(input_idx)) {
					result_validity.SetInvalid(i);
				}
			}
			has_top_level_null = !result_validity.AllValid();
		}
	}
	// set up the correct vector references
	for (idx_t i = 0; i < remap_info.size(); i++) {
		auto &remap = remap_info[i];
		if (remap.index.IsValid() && !remap.child_remap_info.empty()) {
			// nested remap - recurse
			auto &input_vector = *input_vectors[remap.index.GetIndex()];
			reference<Vector> child_default = default_vector;
			if (remap.default_index.IsValid()) {
				auto &defaults = StructVector::GetEntries(default_vector);
				child_default = *defaults[remap.default_index.GetIndex()];
			}
			RemapStruct(input_vector, child_default.get(), *result_vectors[i], result_size, remap.child_remap_info);
			continue;
		}
		// root remap
		if (remap.default_index.IsValid()) {
			auto &defaults = StructVector::GetEntries(default_vector);
			result_vectors[i]->Reference(*defaults[remap.default_index.GetIndex()]);
			if (result_vectors[i]->GetVectorType() != VectorType::CONSTANT_VECTOR) {
				throw InternalException("Default value in remap struct must be a constant");
			}
			if (has_top_level_null && !ConstantVector::IsNull(*result_vectors[i])) {
				// if we have any top-level NULL values and the default value is not NULL, we need to propagate the NULL
				// values to the default value
				result_vectors[i]->Flatten(result_size);
				FlatVector::SetValidity(*result_vectors[i], FlatVector::Validity(result));
			}
		} else {
			result_vectors[i]->Reference(*input_vectors[remap.index.GetIndex()]);
		}
	}
}